

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O0

Vector<float,_4> __thiscall tcu::absDiff<float,4>(tcu *this,Vector<float,_4> *a,Vector<float,_4> *b)

{
  float fVar1;
  float *pfVar2;
  ulong extraout_XMM0_Qa;
  ulong uVar3;
  undefined8 in_XMM1_Qa;
  Vector<float,_4> VVar4;
  undefined4 local_40;
  undefined4 local_24;
  int ndx;
  Vector<float,_4> *b_local;
  Vector<float,_4> *a_local;
  Vector<float,_4> *res;
  
  Vector<float,_4>::Vector((Vector<float,_4> *)this);
  uVar3 = extraout_XMM0_Qa;
  for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
    pfVar2 = Vector<float,_4>::operator[](a,local_24);
    fVar1 = *pfVar2;
    pfVar2 = Vector<float,_4>::operator[](b,local_24);
    if (fVar1 < *pfVar2 || fVar1 == *pfVar2) {
      pfVar2 = Vector<float,_4>::operator[](b,local_24);
      local_40 = *pfVar2;
      pfVar2 = Vector<float,_4>::operator[](a,local_24);
      local_40 = local_40 - *pfVar2;
    }
    else {
      pfVar2 = Vector<float,_4>::operator[](a,local_24);
      local_40 = *pfVar2;
      pfVar2 = Vector<float,_4>::operator[](b,local_24);
      local_40 = local_40 - *pfVar2;
    }
    pfVar2 = Vector<float,_4>::operator[]((Vector<float,_4> *)this,local_24);
    uVar3 = (ulong)(uint)local_40;
    *pfVar2 = local_40;
  }
  VVar4.m_data[2] = (float)(int)in_XMM1_Qa;
  VVar4.m_data[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  VVar4.m_data[0] = (float)(int)uVar3;
  VVar4.m_data[1] = (float)(int)(uVar3 >> 0x20);
  return (Vector<float,_4>)VVar4.m_data;
}

Assistant:

static inline Vector<T, Size> absDiff (const Vector<T, Size>& a, const Vector<T, Size>& b)
{
	Vector<T, Size> res;

	for (int ndx = 0; ndx < Size; ndx++)
		res[ndx] = (a[ndx] > b[ndx]) ? (a[ndx] - b[ndx]) : (b[ndx] - a[ndx]);

	return res;
}